

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O0

bitVector * __thiscall boomphf::bitVector::operator=(bitVector *this,bitVector *r)

{
  bitVector *in_RSI;
  bitVector *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  bitVector *__x;
  
  if (in_RSI != in_RDI) {
    __x = in_RDI;
    if (in_RDI->_bitArray != (uint64_t *)0x0) {
      free(in_RDI->_bitArray);
    }
    in_RDI->_size = in_RSI->_size;
    in_RDI->_nchar = in_RSI->_nchar;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (unaff_retaddr,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)__x);
    in_RDI->_bitArray = in_RSI->_bitArray;
    in_RSI->_bitArray = (uint64_t *)0x0;
  }
  return in_RDI;
}

Assistant:

bitVector &operator=(bitVector &&r)
		{
			//printf("bitVector move assignment \n");
			if (&r != this)
			{
				if(_bitArray != nullptr)
					free(_bitArray);
				
				_size =  std::move (r._size);
				_nchar = std::move (r._nchar);
				_ranks = std::move (r._ranks);
				_bitArray = r._bitArray;
				r._bitArray = nullptr;
			}
			return *this;
		}